

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O3

double __thiscall anon_unknown.dwarf_4bb2::gamma(anon_unknown_dwarf_4bb2 *this,double param_1)

{
  float fVar1;
  float fVar2;
  
  fVar1 = SUB84(param_1,0) * *(float *)(_imath_half_to_float_table + ((ulong)this & 0xffff) * 4);
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  if (1.0 < fVar1) {
    fVar1 = logf((fVar1 + -1.0) * 0.184874 + 1.0);
    fVar1 = fVar1 / 0.184874 + 1.0;
  }
  fVar2 = powf(fVar1,0.4545);
  fVar2 = fVar2 * 84.66;
  fVar1 = 255.0;
  if (fVar2 <= 255.0) {
    fVar1 = fVar2;
  }
  return (double)(ulong)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
}

Assistant:

unsigned char
gamma (half h, float m)
{
    //
    // Conversion from half to unsigned char pixel data,
    // with gamma correction.  The conversion is the same
    // as in the exrdisplay program's ImageView class,
    // except with defog, kneeLow, and kneeHigh fixed
    // at 0.0, 0.0, and 5.0 respectively.
    //

    float x = max (0.f, h * m);

    if (x > 1) x = 1 + knee (x - 1, 0.184874f);

    return (unsigned char) (IMATH_NAMESPACE::clamp (
        std::pow (x, 0.4545f) * 84.66f, 0.f, 255.f));
}